

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::Dump(FunctionBody *dumpFunction)

{
  ushort uVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  byte *pbVar4;
  bool bVar5;
  byte bVar6;
  OpCode op;
  uint32 uVar7;
  uint32 uVar8;
  RegSlot RVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  byte *pbVar15;
  ByteBlock *this;
  char16_t *pcVar16;
  int i;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 auStack_a8 [8];
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  undefined1 local_68 [8];
  ByteCodeReader reader;
  byte local_44;
  LayoutSize local_38;
  uint local_34;
  LayoutSize layoutSize;
  
  ByteCodeReader::Create((ByteCodeReader *)local_68,dumpFunction,0);
  auStack_a8 = (undefined1  [8])0x0;
  statementReader.m_startLocation = (byte *)0x0;
  statementReader.m_statementMap._0_4_ = 0xffffffff;
  statementReader._12_8_ = 0;
  statementReader.m_statementMapIter.accumulatedSourceBegin = 0;
  statementReader.m_statementMapIter.accumulatedBytecodeBegin = 0;
  statementReader.m_statementMapIter.indexOfActualOffset = 0;
  statementReader.m_fullstatementMap._0_4_ = 0;
  statementReader.m_fullstatementMap._4_4_ = 0;
  statementReader.m_nextStatementBoundary._0_4_ = 0;
  statementReader.m_nextStatementBoundary._4_1_ = 1;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)auStack_a8,dumpFunction,0);
  FunctionBody::DumpFullFunctionName(dumpFunction);
  Output::Print(L" (");
  uVar1 = (dumpFunction->super_ParseableFunctionInfo).m_inParamCount;
  if (uVar1 != 0) {
    uVar20 = 0;
    do {
      if (uVar20 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"In%hu",(ulong)uVar20);
      uVar20 = uVar20 + 1;
    } while (uVar1 != uVar20);
  }
  Output::Print(L") ");
  uVar7 = FunctionBody::GetCountField(dumpFunction,ByteCodeCount);
  uVar8 = FunctionBody::GetCountField(dumpFunction,ByteCodeWithoutLDACount);
  Output::Print(L"(size: %d [%d])\n",(ulong)uVar7,(ulong)uVar8);
  pUVar2 = (dumpFunction->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar6 = pUVar2->field_0xa8;
  if ((byte)((bVar6 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0) & (bVar6 & 0x40) >> 6) !=
      0) {
    Output::Print(L"[Bytecode was generated for debug mode]\n");
  }
  if (((dumpFunction->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) != 0) {
    Output::Print(L"[A reparse is being done]\n");
  }
  RVar9 = FunctionBody::GetLocalsCount(dumpFunction);
  RVar10 = FunctionBody::GetTempCount(dumpFunction);
  RVar11 = FunctionBody::GetFirstTmpReg(dumpFunction);
  uVar7 = FunctionBody::GetCountField(dumpFunction,InlineCacheCount);
  Output::Print(L"      %u locals (%u temps from R%u), %u inline cache\n",(ulong)RVar9,(ulong)RVar10
                ,(ulong)RVar11,(ulong)uVar7);
  DumpConstantTable(dumpFunction);
  DumpImplicitArgIns(dumpFunction);
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar7 = 0;
  reader.m_endLocation = (byte *)dumpFunction;
  while( true ) {
    while( true ) {
      pbVar4 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                                statementReader.m_fullstatementMap._0_4_);
      pbVar15 = ByteCodeReader::GetIP((ByteCodeReader *)local_68);
      if (pbVar4 != pbVar15) break;
      FunctionBody::PrintStatementSourceLine(dumpFunction,uVar7);
      uVar7 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::MoveNextStatementBoundary
                        ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                          *)auStack_a8);
    }
    uVar12 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)local_68);
    op = ByteCodeReader::ReadOp((ByteCodeReader *)local_68,&local_38);
    if (op == EndOfBlock) break;
    pcVar16 = L"";
    if (local_38 == MediumLayout) {
      pcVar16 = L"M-";
    }
    if (local_38 == LargeLayout) {
      pcVar16 = L"L-";
    }
    Output::Print(L"    %04x %2s",(ulong)uVar12,pcVar16);
    local_34 = (uint)op;
    DumpOp(op,local_38,(ByteCodeReader *)local_68,dumpFunction);
    if (DAT_015bc46a == '\x01') {
      uVar17 = uVar12 + 2;
      uVar13 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)local_68);
      Output::SkipToColumn(0x46);
      if (local_38 == SmallLayout) {
LAB_007e9f39:
        if (0xff < local_34) {
          uVar19 = 1;
          goto LAB_007e9f4e;
        }
        Output::Print(L"   ");
        uVar17 = uVar12 + 1;
      }
      else {
        if (local_38 == MediumLayout) {
          iVar18 = 2;
        }
        else {
          if (local_38 != LargeLayout) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                        ,0x6a,"(layoutSize == SmallLayout)",
                                        "layoutSize == SmallLayout");
            if (bVar5) {
              *puVar14 = 0;
              goto LAB_007e9f39;
            }
            goto LAB_007ea070;
          }
          iVar18 = 4;
        }
        uVar19 = (ulong)((iVar18 + 1) - (uint)(local_34 < 0x100));
LAB_007e9f4e:
        Output::Print(L"%02X ",uVar19);
      }
      local_44 = (byte)op;
      Output::Print(L"%02x",(ulong)local_44);
      if ((int)uVar17 < (int)uVar13) {
        do {
          bVar6 = ByteCodeReader::GetRawByte((ByteCodeReader *)local_68,uVar17);
          Output::Print(L" %02x",(ulong)bVar6);
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
      }
    }
    Output::Print(L"\n");
    dumpFunction = (FunctionBody *)reader.m_endLocation;
  }
  uVar12 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)local_68);
  this = FunctionBody::GetByteCode(dumpFunction);
  uVar17 = ByteBlock::GetLength(this);
  if (uVar12 != uVar17) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar14 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x52,
                                "(reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength())"
                                ,
                                "reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength()"
                               );
    if (!bVar5) {
LAB_007ea070:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar14 = 0;
  }
  pbVar4 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                            statementReader.m_fullstatementMap._0_4_);
  pbVar15 = ByteCodeReader::GetIP((ByteCodeReader *)local_68);
  if (pbVar4 == pbVar15) {
    FunctionBody::PrintStatementSourceLine(dumpFunction,uVar7);
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::MoveNextStatementBoundary
              ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                *)auStack_a8);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void ByteCodeDumper::Dump(FunctionBody* dumpFunction)
    {
        ByteCodeReader reader;
        reader.Create(dumpFunction);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(dumpFunction);
        dumpFunction->DumpFullFunctionName();
        Output::Print(_u(" ("));
        ArgSlot inParamCount = dumpFunction->GetInParamsCount();
        for (ArgSlot paramIndex = 0; paramIndex < inParamCount; paramIndex++)
        {
            if (paramIndex > 0)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("In%hu"), paramIndex);
        }
        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), dumpFunction->GetByteCodeCount(), dumpFunction->GetByteCodeWithoutLDACount());
#if defined(DBG) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (dumpFunction->IsInDebugMode())
        {
            Output::Print(_u("[Bytecode was generated for debug mode]\n"));
        }
#endif
#if DBG
        if (dumpFunction->IsReparsed())
        {
            Output::Print(_u("[A reparse is being done]\n"));
        }
#endif
        Output::Print(
            _u("      %u locals (%u temps from R%u), %u inline cache\n"),
            dumpFunction->GetLocalsCount(),
            dumpFunction->GetTempCount(),
            dumpFunction->GetFirstTmpReg(),
            dumpFunction->GetInlineCacheCount());
        uint32 statementIndex = 0;
        ByteCodeDumper::DumpConstantTable(dumpFunction);
        ByteCodeDumper::DumpImplicitArgIns(dumpFunction);
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                dumpFunction->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            uint byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCode op = reader.ReadOp(layoutSize);
            if (op == OpCode::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout? _u("L-") : layoutSize == MediumLayout? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, dumpFunction);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account fo the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCode::MaxByteSizedOpcodes?
                            Js::OpCode::ExtendedLargeLayoutPrefix : Js::OpCode::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCode::MaxByteSizedOpcodes?
                            Js::OpCode::ExtendedMediumLayoutPrefix : Js::OpCode::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCode::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCode::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            dumpFunction->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }